

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoDebugger.cpp
# Opt level: O2

void __thiscall NanoDebugger::NanoDebugger(NanoDebugger *this,string *file)

{
  _Rb_tree_header *p_Var1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)file);
  NanoVM::NanoVM(&this->super_NanoVM,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->breakpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->breakpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->breakpoints)._M_t._M_impl.super__Rb_tree_header;
  (this->breakpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->breakpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->breakpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->run = false;
  return;
}

Assistant:

NanoDebugger::NanoDebugger(std::string file) : NanoVM(file) {
	run = false;
}